

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O2

void __thiscall memory_io_buf::memory_io_buf(memory_io_buf *this)

{
  int local_1c;
  
  io_buf::io_buf(&this->super_io_buf);
  (this->super_io_buf)._vptr_io_buf = (_func_int **)&PTR_open_file_002d0bd0;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->readOffset = 0;
  local_1c = -1;
  v_array<int>::push_back(&(this->super_io_buf).files,&local_1c);
  return;
}

Assistant:

memory_io_buf() : readOffset(0) {
        files.push_back(-1); // this is a hack because buf will do nothing if files is empty
    }